

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboDepthbufferTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::BasicFboDepthCase::render(BasicFboDepthCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  int width;
  int height;
  int i;
  deUint32 program;
  deUint32 program_00;
  long lVar1;
  Context *pCVar2;
  int i_1;
  deUint32 depthRbo;
  deUint32 colorRbo;
  deUint32 gridTex;
  deUint32 fbo;
  float clearDepth;
  TextureLevel data;
  PixelBufferAccess local_378;
  Vec4 local_348;
  Surface *local_338;
  Vec4 local_330;
  GradientShader gradShader;
  Texture2DShader texShader;
  
  fbo = 0;
  colorRbo = 0;
  depthRbo = 0;
  FboTestUtil::GradientShader::GradientShader(&gradShader,TYPE_FLOAT_VEC4);
  data.m_format.order = R;
  data.m_format.type = SNORM_INT8;
  data.m_size.m_data[0] = 0;
  data.m_size.m_data[1] = 0;
  data.m_size.m_data[2] = 0;
  data._20_4_ = 0;
  local_378.super_ConstPixelBufferAccess.m_format.order = 0x28;
  std::vector<glu::DataType,std::allocator<glu::DataType>>::_M_realloc_insert<glu::DataType_const&>
            ((vector<glu::DataType,std::allocator<glu::DataType>> *)&data,(iterator)0x0,
             (DataType *)&local_378);
  lVar1 = 0;
  do {
    local_378.super_ConstPixelBufferAccess.m_size.m_data[lVar1 + -2] = 0x3f800000;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_348.m_data[0] = 0.0;
  local_348.m_data[1] = 0.0;
  local_348.m_data[2] = 0.0;
  local_348.m_data[3] = 0.0;
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texShader,(DataTypes *)&data,TYPE_FLOAT_VEC4,(Vec4 *)&local_378,&local_348);
  if (data.m_format != (TextureFormat)0x0) {
    operator_delete((void *)data.m_format,data._16_8_ - (long)data.m_format);
  }
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar2->_vptr_Context[0x75])(pCVar2,&gradShader);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
  program_00 = (*pCVar2->_vptr_Context[0x75])(pCVar2,&texShader);
  clearDepth = 1.0;
  pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
  data.m_format.order = R;
  data.m_format.type = SNORM_INT8;
  data.m_size.m_data[0] = 0;
  data.m_size.m_data[1] = 0;
  lVar1 = 0;
  do {
    local_378.super_ConstPixelBufferAccess.m_size.m_data[lVar1 + -2] = 0x3f800000;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  FboTestUtil::GradientShader::setGradient
            (&gradShader,pCVar2,program,(Vec4 *)&data,(Vec4 *)&local_378);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::Texture2DShader::setUniforms(&texShader,pCVar2,program_00);
  sglr::ContextWrapper::glGenFramebuffers(this_00,1,&fbo);
  sglr::ContextWrapper::glGenRenderbuffers(this_00,1,&colorRbo);
  sglr::ContextWrapper::glGenRenderbuffers(this_00,1,&depthRbo);
  sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,colorRbo);
  sglr::ContextWrapper::glRenderbufferStorage(this_00,0x8d41,0x8058,this->m_width,this->m_height);
  sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,depthRbo);
  sglr::ContextWrapper::glRenderbufferStorage
            (this_00,0x8d41,this->m_format,this->m_width,this->m_height);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,colorRbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8d00,0x8d41,depthRbo);
  FboTestCase::checkError(&this->super_FboTestCase);
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  sglr::ContextWrapper::glViewport(this_00,0,0,this->m_width,this->m_height);
  sglr::ContextWrapper::glClearBufferfv(this_00,0x1801,0,&clearDepth);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
  data.m_format.order = 0xbf800000;
  data.m_format.type = 0xbf800000;
  data.m_size.m_data[0] = -0x40800000;
  local_378.super_ConstPixelBufferAccess.m_format = (TextureFormat)&DAT_3f8000003f800000;
  local_378.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3f800000;
  local_338 = dst;
  sglr::drawQuad(pCVar2,program,(Vec3 *)&data,(Vec3 *)&local_378);
  gridTex = 0;
  local_378.super_ConstPixelBufferAccess.m_format = glu::mapGLTransferFormat(0x1908,0x1401);
  tcu::TextureLevel::TextureLevel(&data,(TextureFormat *)&local_378,0x80,0x80,1);
  tcu::TextureLevel::getAccess(&local_378,&data);
  local_348.m_data[0] = 0.2;
  local_348.m_data[1] = 0.7;
  local_348.m_data[2] = 0.1;
  local_348.m_data[3] = 1.0;
  local_330.m_data[0] = 0.7;
  local_330.m_data[1] = 0.1;
  local_330.m_data[2] = 0.5;
  local_330.m_data[3] = 0.8;
  tcu::fillWithGrid(&local_378,8,&local_348,&local_330);
  sglr::ContextWrapper::glGenTextures(this_00,1,&gridTex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,gridTex);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2601);
  tcu::TextureLevel::getAccess(&local_378,&data);
  sglr::ContextWrapper::glTexImage2D
            (this_00,0xde1,0,0x1908,0x80,0x80,0,0x1908,0x1401,
             local_378.super_ConstPixelBufferAccess.m_data);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_378.super_ConstPixelBufferAccess.m_format.order = 0xbf800000;
  local_378.super_ConstPixelBufferAccess.m_format.type = 0xbf800000;
  local_378.super_ConstPixelBufferAccess.m_size.m_data._0_8_ =
       (ulong)(uint)local_378.super_ConstPixelBufferAccess.m_size.m_data[1] << 0x20;
  local_348.m_data._0_8_ = &DAT_3f8000003f800000;
  local_348.m_data._8_8_ = local_348.m_data._8_8_ & 0xffffffff00000000;
  sglr::drawQuad(pCVar2,program_00,(Vec3 *)&local_378,(Vec3 *)&local_348);
  tcu::TextureLevel::~TextureLevel(&data);
  width = this->m_width;
  height = this->m_height;
  local_348.m_data._0_8_ = glu::mapGLInternalFormat(0x8058);
  lVar1 = 0;
  do {
    data.m_size.m_data[lVar1 + -2] = 0x3f800000;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_378.super_ConstPixelBufferAccess.m_format.order = R;
  local_378.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  local_378.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  local_378.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  FboTestCase::readPixels
            (&this->super_FboTestCase,local_338,0,0,width,height,(TextureFormat *)&local_348,
             (Vec4 *)&data,(Vec4 *)&local_378);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texShader);
  sglr::ShaderProgram::~ShaderProgram(&gradShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		const deUint32	colorFormat		= GL_RGBA8;
		deUint32		fbo				= 0;
		deUint32		colorRbo		= 0;
		deUint32		depthRbo		= 0;
		GradientShader	gradShader		(glu::TYPE_FLOAT_VEC4);
		Texture2DShader	texShader		(DataTypes() << glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC4);
		deUint32		gradShaderID	= getCurrentContext()->createProgram(&gradShader);
		deUint32		texShaderID		= getCurrentContext()->createProgram(&texShader);
		float			clearDepth		= 1.0f;

		// Setup shaders
		gradShader.setGradient(*getCurrentContext(), gradShaderID, tcu::Vec4(0.0f), tcu::Vec4(1.0f));
		texShader.setUniforms (*getCurrentContext(), texShaderID);

		// Setup FBO

		glGenFramebuffers(1, &fbo);
		glGenRenderbuffers(1, &colorRbo);
		glGenRenderbuffers(1, &depthRbo);

		glBindRenderbuffer(GL_RENDERBUFFER, colorRbo);
		glRenderbufferStorage(GL_RENDERBUFFER, colorFormat, m_width, m_height);

		glBindRenderbuffer(GL_RENDERBUFFER, depthRbo);
		glRenderbufferStorage(GL_RENDERBUFFER, m_format, m_width, m_height);

		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthRbo);
		checkError();
		checkFramebufferStatus(GL_FRAMEBUFFER);

		glViewport(0, 0, m_width, m_height);

		// Clear depth to 1
		glClearBufferfv(GL_DEPTH, 0, &clearDepth);

		// Render gradient with depth = [-1..1]
		glEnable(GL_DEPTH_TEST);
		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		// Render grid pattern with depth = 0
		{
			const deUint32		format		= GL_RGBA;
			const deUint32		dataType	= GL_UNSIGNED_BYTE;
			const int			texW		= 128;
			const int			texH		= 128;
			deUint32			gridTex		= 0;
			tcu::TextureLevel	data		(glu::mapGLTransferFormat(format, dataType), texW, texH, 1);

			tcu::fillWithGrid(data.getAccess(), 8, Vec4(0.2f, 0.7f, 0.1f, 1.0f), Vec4(0.7f, 0.1f, 0.5f, 0.8f));

			glGenTextures(1, &gridTex);
			glBindTexture(GL_TEXTURE_2D, gridTex);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_LINEAR);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, format, texW, texH, 0, format, dataType, data.getAccess().getDataPtr());

			sglr::drawQuad(*getCurrentContext(), texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		// Read results.
		readPixels(dst, 0, 0, m_width, m_height, glu::mapGLInternalFormat(colorFormat), Vec4(1.0f), Vec4(0.0f));
	}